

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserInterface.cpp
# Opt level: O1

void __thiscall DropdownMenu::addMenuButton(DropdownMenu *this,TextButton *menuButton)

{
  RectangleShape *this_00;
  float fVar1;
  float fVar2;
  pointer pTVar3;
  bool bVar4;
  uint uVar5;
  Vector2f *pVVar6;
  Vector2f *pVVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  RectangleShape *pRVar11;
  Vector2f newBackgroundSize;
  Vector2f local_40;
  Vector2f local_38;
  
  std::vector<TextButton,_std::allocator<TextButton>_>::push_back(&this->menuButtons,menuButton);
  pTVar3 = (this->menuButtons).super__Vector_base<TextButton,_std::allocator<TextButton>_>._M_impl.
           super__Vector_impl_data._M_finish;
  this_00 = &this->background;
  pVVar6 = sf::Transformable::getPosition(&(this->background).super_Shape.super_Transformable);
  pVVar7 = sf::RectangleShape::getSize(this_00);
  local_38.y = pVVar7->y + -2.0 + (*pVVar6).y;
  local_38.x = (*pVVar6).x + 2.0;
  sf::Transformable::setPosition(&pTVar3[-1].super_UIComponent.super_Transformable,&local_38);
  pVVar6 = sf::RectangleShape::getSize(this_00);
  fVar1 = pVVar6->x;
  pVVar6 = sf::RectangleShape::getSize(this_00);
  fVar2 = pVVar6->y;
  pRVar11 = &menuButton->button;
  pVVar6 = sf::RectangleShape::getSize(pRVar11);
  local_38.y = fVar2 + pVVar6->y;
  local_38.x = fVar1;
  pVVar6 = sf::RectangleShape::getSize(pRVar11);
  fVar2 = pVVar6->x;
  pVVar6 = sf::RectangleShape::getSize(pRVar11);
  if (fVar2 + 4.0 <= fVar1) {
    fVar1 = this->maxMenuButtonWidth;
    if (pVVar6->x < fVar1) {
      pTVar3 = (this->menuButtons).super__Vector_base<TextButton,_std::allocator<TextButton>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      pVVar6 = sf::RectangleShape::getSize(pRVar11);
      local_40.y = pVVar6->y;
      local_40.x = fVar1;
      sf::RectangleShape::setSize(&pTVar3[-1].button,&local_40);
    }
  }
  else {
    local_38.x = pVVar6->x + 4.0;
    pVVar6 = sf::RectangleShape::getSize(pRVar11);
    this->maxMenuButtonWidth = pVVar6->x;
    uVar5 = (int)((ulong)((long)(this->menuButtons).
                                super__Vector_base<TextButton,_std::allocator<TextButton>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)(this->menuButtons).
                               super__Vector_base<TextButton,_std::allocator<TextButton>_>._M_impl.
                               super__Vector_impl_data._M_start) >> 4) * -0x5f75270d - 2;
    if (-1 < (int)uVar5) {
      lVar8 = (ulong)uVar5 * 0x3b0 + 0x228;
      lVar9 = (ulong)uVar5 + 1;
      do {
        pRVar11 = (RectangleShape *)
                  ((long)&(((this->menuButtons).
                            super__Vector_base<TextButton,_std::allocator<TextButton>_>._M_impl.
                            super__Vector_impl_data._M_start)->super_UIComponent).
                          super_Transformable.m_transform + lVar8 + 0xffffffffffffffd4U);
        fVar1 = this->maxMenuButtonWidth;
        pVVar6 = sf::RectangleShape::getSize(pRVar11);
        local_40.y = pVVar6->y;
        local_40.x = fVar1;
        sf::RectangleShape::setSize(pRVar11,&local_40);
        lVar8 = lVar8 + -0x3b0;
        lVar10 = lVar9 + -1;
        bVar4 = 0 < lVar9;
        lVar9 = lVar10;
      } while (lVar10 != 0 && bVar4);
    }
  }
  sf::RectangleShape::setSize(this_00,&local_38);
  return;
}

Assistant:

void DropdownMenu::addMenuButton(const TextButton& menuButton) {
    menuButtons.push_back(menuButton);
    menuButtons.back().setPosition(background.getPosition() + Vector2f(2.0f, background.getSize().y - 2.0f));
    Vector2f newBackgroundSize(background.getSize().x, background.getSize().y + menuButton.button.getSize().y);
    if (newBackgroundSize.x < menuButton.button.getSize().x + 4.0f) {
        newBackgroundSize.x = menuButton.button.getSize().x + 4.0f;
        maxMenuButtonWidth = menuButton.button.getSize().x;
        for (int i = menuButtons.size() - 2; i >= 0; --i) {
            menuButtons[i].button.setSize(Vector2f(maxMenuButtonWidth, menuButtons[i].button.getSize().y));
        }
    } else if (menuButton.button.getSize().x < maxMenuButtonWidth) {
        menuButtons.back().button.setSize(Vector2f(maxMenuButtonWidth, menuButton.button.getSize().y));
    }
    background.setSize(newBackgroundSize);
}